

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> * __thiscall
pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
          (vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *this,
          vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *other)

{
  Half *pHVar1;
  size_t sVar2;
  Half *pHVar3;
  size_t sVar4;
  
  if (this != other) {
    this->nStored = 0;
    reserve(this,other->nStored);
    pHVar1 = other->ptr;
    sVar2 = other->nStored;
    pHVar3 = this->ptr;
    for (sVar4 = 0; sVar2 != sVar4; sVar4 = sVar4 + 1) {
      pHVar3[sVar4].h = pHVar1[sVar4].h;
    }
    this->nStored = sVar2;
  }
  return this;
}

Assistant:

vector &operator=(const vector &other) {
        if (this == &other)
            return *this;

        clear();
        reserve(other.size());
        for (size_t i = 0; i < other.size(); ++i)
            alloc.template construct<T>(ptr + i, other[i]);
        nStored = other.size();

        return *this;
    }